

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.hpp
# Opt level: O3

void __thiscall
FastqReader<FastqRecord>::FastqReader
          (FastqReader<FastqRecord> *this,FastxReaderParams params,string *filepath)

{
  int iVar1;
  gzFile_s *pgVar2;
  kstream<gzFile_s_*,_FunctorZlib> *this_00;
  char *pcVar3;
  ostream *poVar4;
  int *piVar5;
  runtime_error *this_01;
  long *plVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->seq).name._M_dataplus._M_p = (pointer)&(this->seq).name.field_2;
  (this->seq).name._M_string_length = 0;
  (this->seq).name.field_2._M_local_buf[0] = '\0';
  (this->seq).comment._M_dataplus._M_p = (pointer)&(this->seq).comment.field_2;
  (this->seq).comment._M_string_length = 0;
  (this->seq).comment.field_2._M_local_buf[0] = '\0';
  (this->seq).seq._M_dataplus._M_p = (pointer)&(this->seq).seq.field_2;
  (this->seq).seq._M_string_length = 0;
  (this->seq).seq.field_2._M_local_buf[0] = '\0';
  (this->seq).qual._M_dataplus._M_p = (pointer)&(this->seq).qual.field_2;
  (this->seq).qual._M_string_length = 0;
  (this->seq).qual.field_2._M_local_buf[0] = '\0';
  (this->seq).last_char = 0;
  this->numRecords = 0;
  this->fq_File = 0;
  (this->params).min_length = params.min_length;
  (this->stats).totalRecords = 0;
  (this->stats).filteredRecords = 0;
  (this->stats).totalLength = 0;
  (this->stats).filteredLength = 0;
  this->eof_flag = false;
  pgVar2 = (gzFile_s *)gzopen((filepath->_M_dataplus)._M_p,"r");
  this->gz_file = pgVar2;
  if (pgVar2 != (gzFile_s *)0x0) {
    this_00 = (kstream<gzFile_s_*,_FunctorZlib> *)operator_new(0x30);
    this_00->begin = 0;
    this_00->end = 0;
    this_00->is_eof = 0;
    this_00->f = pgVar2;
    this_00->bufferSize = 0x1000;
    pcVar3 = (char *)malloc(0x1000);
    this_00->buf = pcVar3;
    iVar1 = kstream<gzFile_s_*,_FunctorZlib>::getHeader(this_00);
    this_00->c = iVar1;
    this->ks = this_00;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error opening FASTQ ",0x14);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filepath->_M_dataplus)._M_p,filepath->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  piVar5 = __errno_location();
  pcVar3 = strerror(*piVar5);
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"Error opening ",filepath);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_70 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  strerror(*piVar5);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_50 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar6[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_50);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit FastqReader(FastxReaderParams params, const std::string &filepath) : params(params), numRecords(0),eof_flag(false) {
        //sdglib::OutputLog() << "Opening: " << filepath << "\n";
        gz_file = gzopen(filepath.c_str(), "r");
        if (gz_file == Z_NULL) {
            std::cout << "Error opening FASTQ " << filepath << ": " << std::strerror(errno) << std::endl;
            throw std::runtime_error("Error opening " + filepath + ": " + std::strerror(errno));
        }
        ks = new kstream<gzFile, FunctorZlib>(gz_file, gzr);
    }